

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zg.cc
# Opt level: O2

zg_t * tchecker::zg::factory
                 (shared_ptr<const_tchecker::ta::system_t> *system,sharing_type_t sharing_type,
                 semantics_type_t semantics_type,extrapolation_type_t extrapolation_type,
                 size_t block_size,size_t table_size)

{
  extrapolation_t *__p;
  semantics_t *__p_00;
  zg_t *this;
  shared_ptr<tchecker::zg::semantics_t> semantics;
  shared_ptr<tchecker::zg::extrapolation_t> extrapolation;
  shared_ptr<tchecker::zg::semantics_t> local_50;
  shared_ptr<tchecker::zg::extrapolation_t> local_40;
  
  __p = extrapolation_factory
                  (extrapolation_type,
                   (system->
                   super___shared_ptr<const_tchecker::ta::system_t,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr);
  std::__shared_ptr<tchecker::zg::extrapolation_t,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<tchecker::zg::extrapolation_t,void>
            ((__shared_ptr<tchecker::zg::extrapolation_t,(__gnu_cxx::_Lock_policy)2> *)&local_40,__p
            );
  if (local_40.super___shared_ptr<tchecker::zg::extrapolation_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      == (element_type *)0x0) {
    this = (zg_t *)0x0;
  }
  else {
    __p_00 = semantics_factory(semantics_type);
    std::__shared_ptr<tchecker::zg::semantics_t,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<tchecker::zg::semantics_t,void>
              ((__shared_ptr<tchecker::zg::semantics_t,(__gnu_cxx::_Lock_policy)2> *)&local_50,
               __p_00);
    this = (zg_t *)operator_new(0x2e0);
    zg_t::zg_t(this,system,sharing_type,&local_50,&local_40,block_size,table_size);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_50.super___shared_ptr<tchecker::zg::semantics_t,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_40.super___shared_ptr<tchecker::zg::extrapolation_t,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return this;
}

Assistant:

tchecker::zg::zg_t * factory(std::shared_ptr<tchecker::ta::system_t const> const & system,
                             enum tchecker::ts::sharing_type_t sharing_type, enum tchecker::zg::semantics_type_t semantics_type,
                             enum tchecker::zg::extrapolation_type_t extrapolation_type, std::size_t block_size,
                             std::size_t table_size)
{
  std::shared_ptr<tchecker::zg::extrapolation_t> extrapolation{
      tchecker::zg::extrapolation_factory(extrapolation_type, *system)};
  if (extrapolation.get() == nullptr)
    return nullptr;
  std::shared_ptr<tchecker::zg::semantics_t> semantics{tchecker::zg::semantics_factory(semantics_type)};
  return new tchecker::zg::zg_t(system, sharing_type, semantics, extrapolation, block_size, table_size);
}